

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O1

uint __thiscall Shell::TermAlgebra::getSubtermPredicate(TermAlgebra *this)

{
  uint uVar1;
  uint64_t uVar2;
  Symbol *this_00;
  Signature *this_01;
  uint uVar3;
  OperatorKey *key;
  OperatorType *type;
  ulong uVar4;
  bool added;
  bool local_59;
  undefined1 local_58 [40];
  
  this_01 = DAT_00b7e1b0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "$subterm",
                 &(DAT_00b7e1b0->_typeCons)._stack[*(uint *)((this->_sort)._content + 8)]->_name);
  uVar3 = Kernel::Signature::addPredicate
                    (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,(*(uint *)((this->_sort)._content + 0xc) & 0xfffffff) + 2,
                     &local_59);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (local_59 == true) {
    local_58._16_8_ = (uint64_t *)0x0;
    local_58._24_8_ = (uint64_t *)0x0;
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (TermList *)0x0;
    uVar2 = (this->_sort)._content;
    ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_58);
    *(uint64_t *)local_58._16_8_ = uVar2;
    local_58._16_8_ = local_58._16_8_ + 8;
    uVar2 = (this->_sort)._content;
    if (local_58._16_8_ == local_58._24_8_) {
      ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_58);
    }
    *(uint64_t *)local_58._16_8_ = uVar2;
    local_58._16_8_ = local_58._16_8_ + 8;
    this_00 = (DAT_00b7e1b0->_preds)._stack[uVar3];
    uVar4 = (ulong)(local_58._16_8_ - local_58._8_8_) >> 3;
    uVar1 = *(uint *)((this->_sort)._content + 0xc);
    key = Kernel::OperatorType::setupKey((uint)uVar4,(TermList *)local_58._8_8_);
    *(undefined8 *)(key + (uVar4 & 0xffffffff) * 8 + 8) = 2;
    type = Kernel::OperatorType::getTypeFromKey(key,uVar1 & 0xfffffff);
    Kernel::Signature::Symbol::setType(this_00,type);
    if ((TermList *)local_58._8_8_ != (TermList *)0x0) {
      uVar4 = local_58._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._8_8_;
      }
      else if (uVar4 < 0x11) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._8_8_;
      }
      else if (uVar4 < 0x19) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._8_8_;
      }
      else if (uVar4 < 0x21) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._8_8_;
      }
      else if (uVar4 < 0x31) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._8_8_;
      }
      else if (uVar4 < 0x41) {
        *(uint64_t *)local_58._8_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._8_8_;
      }
      else {
        operator_delete((void *)local_58._8_8_,0x10);
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned TermAlgebra::getSubtermPredicate() {
  bool added;
  unsigned s = env.signature->addPredicate(getSubtermPredicateName(), nTypeArgs()+2, added);

  if (added) {
    // declare a binary predicate subterm
    TermStack args;
    args.push(_sort);
    args.push(_sort);
    env.signature->getPredicate(s)->setType(OperatorType::getPredicateType(args.size(),args.begin(),nTypeArgs()));
  }

  return s;
}